

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O2

int point_mul_two_id_tc26_gost_3410_2012_512_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  pt_prj_t_conflict2 *ppVar11;
  uint64_t *puVar12;
  pt_aff_t_conflict2 *ppVar13;
  limb_t *plVar14;
  pt_prj_t_conflict2 *ppVar15;
  uint64_t *puVar16;
  byte bVar17;
  uint uVar18;
  byte bVar19;
  pt_prj_t_conflict2 Q;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  uchar b_n [64];
  pt_aff_t_conflict2 local_13f8;
  int8_t bnaf [513];
  int8_t anaf [513];
  pt_prj_t_conflict2 local_f38 [16];
  
  bVar19 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar5 = 0;
  if (((((pBVar7 != (BIGNUM *)0x0) &&
        (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar6,pBVar7), iVar3 != 0)) &&
       (iVar3 = BN_bn2lebinpad(pBVar6,b_x,0x40), iVar5 = iVar4, iVar3 == 0x40)) &&
      ((iVar4 = BN_bn2lebinpad(pBVar7,b_y,0x40), iVar4 == 0x40 &&
       (iVar4 = BN_bn2lebinpad(n,b_n,0x40), iVar4 == 0x40)))) &&
     (iVar4 = BN_bn2lebinpad(m,b_m,0x40), iVar4 == 0x40)) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_from_bytes(local_13f8.X,b_x);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_from_bytes(local_13f8.Y,b_y);
    memset(anaf,0,0x201);
    memset(bnaf,0,0x201);
    memset(&Q,0,0xf0);
    precomp_wnaf(local_f38,&local_13f8);
    scalar_wnaf(anaf,b_n);
    scalar_wnaf(bnaf,b_m);
    bVar17 = 0;
    bVar2 = true;
    for (uVar18 = 0x200; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
      if (!bVar2) {
        point_double(&Q,&Q);
      }
      bVar1 = bnaf[uVar18];
      if (bVar1 != 0) {
        if (bVar17 != bVar1 >> 7) {
          fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(Q.Y,Q.Y);
          bVar17 = bVar17 ^ 1;
        }
        uVar8 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar8 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          lVar10 = 10;
          ppVar11 = local_f38 + (int)uVar8;
          ppVar15 = &Q;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            ppVar15->X[0] = ppVar11->X[0];
            ppVar11 = (pt_prj_t_conflict2 *)((long)ppVar11 + (ulong)bVar19 * -0x10 + 8);
            ppVar15 = (pt_prj_t_conflict2 *)((long)ppVar15 + (ulong)bVar19 * -0x10 + 8);
          }
          puVar12 = local_f38[(int)uVar8].Y;
          puVar16 = Q.Y;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar16 = *puVar12;
            puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
            puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
          }
          puVar12 = local_f38[(int)uVar8].Z;
          puVar16 = Q.Z;
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar16 = *puVar12;
            puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
            puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
          }
        }
        else {
          point_add_proj(&Q,&Q,local_f38 + (int)uVar8);
        }
        bVar2 = false;
      }
      bVar1 = anaf[uVar18];
      if (bVar1 != 0) {
        if (bVar17 != bVar1 >> 7) {
          fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(Q.Y,Q.Y);
          bVar17 = bVar17 ^ 1;
        }
        uVar8 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar8 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          lVar10 = 10;
          ppVar13 = lut_cmb[0] + (int)uVar8;
          ppVar11 = &Q;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            ppVar11->X[0] = ppVar13->X[0];
            ppVar13 = (pt_aff_t_conflict2 *)((long)ppVar13 + (ulong)bVar19 * -0x10 + 8);
            ppVar11 = (pt_prj_t_conflict2 *)((long)ppVar11 + (ulong)bVar19 * -0x10 + 8);
          }
          puVar12 = lut_cmb[0][(int)uVar8].Y;
          puVar16 = Q.Y;
          for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar16 = *puVar12;
            puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
            puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
          }
          plVar14 = const_one;
          puVar12 = Q.Z;
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar12 = *plVar14;
            plVar14 = plVar14 + (ulong)bVar19 * -2 + 1;
            puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
          }
        }
        else {
          point_add_mixed(&Q,&Q,lut_cmb[0] + (int)uVar8);
        }
        bVar2 = false;
      }
    }
    puVar12 = Q.Y;
    if (bVar2) {
      Q.X[8] = 0;
      Q.X[9] = 0;
      Q.X[6] = 0;
      Q.X[7] = 0;
      Q.X[4] = 0;
      Q.X[5] = 0;
      Q.X[2] = 0;
      Q.X[3] = 0;
      Q.X[0] = 0;
      Q.X[1] = 0;
      plVar14 = const_one;
      puVar16 = puVar12;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar16 = *plVar14;
        plVar14 = plVar14 + (ulong)bVar19 * -2 + 1;
        puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
      }
      Q.Z[8] = 0;
      Q.Z[9] = 0;
      Q.Z[6] = 0;
      Q.Z[7] = 0;
      Q.Z[4] = 0;
      Q.Z[5] = 0;
      Q.Z[2] = 0;
      Q.Z[3] = 0;
      Q.Z[0] = 0;
      Q.Z[1] = 0;
    }
    if (bVar17 != 0) {
      fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(puVar12,puVar12);
    }
    puVar16 = Q.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(puVar16,puVar16);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_13f8.X,Q.X,puVar16);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_13f8.Y,puVar12,puVar16);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(b_x,local_13f8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(b_y,local_13f8.Y);
    iVar5 = CRYPTO_memcmp("",b_x,0x40);
    if ((iVar5 == 0) && (iVar5 = CRYPTO_memcmp("",b_y,0x40), iVar5 == 0)) {
      iVar5 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar5 == 0) {
        iVar5 = 0;
        goto LAB_0012cc40;
      }
    }
    else {
      lVar10 = BN_lebin2bn(b_x,0x40,pBVar6);
      iVar5 = 0;
      if ((lVar10 == 0) ||
         ((lVar10 = BN_lebin2bn(b_y,0x40,pBVar7), lVar10 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar6,pBVar7,ctx), iVar4 == 0))))
      goto LAB_0012cc40;
    }
    iVar5 = 1;
  }
LAB_0012cc40:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar5;
}

Assistant:

int
    point_mul_two_id_tc26_gost_3410_2012_512_paramSetA(
        const EC_GROUP *group, EC_POINT *r, const BIGNUM *n, const EC_POINT *q,
        const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(n, b_n, 64) != 64 || BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}